

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

int __thiscall
fmp4_stream::ingest_stream::load_from_file(ingest_stream *this,istream *infile,bool init_only)

{
  string *psVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  char *pcVar4;
  pointer puVar5;
  uint64_t uVar6;
  undefined8 uVar7;
  bool bVar8;
  undefined8 *puVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  int iVar10;
  ssize_t sVar11;
  ulong uVar12;
  size_t sVar13;
  ostream *poVar14;
  size_t in_RCX;
  undefined7 in_register_00000011;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf;
  long lVar15;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar16;
  pointer pbVar17;
  uint data_size;
  uint uVar18;
  bool bVar19;
  uint8_t name [9];
  vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> ingest_boxes;
  string enc_box_name;
  emsg e_1;
  exception e;
  uint local_6d8;
  uint uStack_6d4;
  undefined1 local_6d0;
  vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_> *local_6c8;
  undefined4 local_6bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6b0;
  vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> local_6a8;
  char *local_690 [2];
  char local_680 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_670;
  uint8_t *local_668;
  string *local_660;
  uint32_t *local_658;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_650;
  uint8_t *local_648;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_640;
  uint8_t *local_638;
  string *local_630;
  uint32_t *local_628;
  string *local_620;
  uint32_t *local_618;
  vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_> *local_610;
  undefined8 *local_608;
  undefined8 *local_600;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_5f8;
  uint8_t *local_5f0;
  uint32_t *local_5e8;
  string *local_5e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_5d8;
  uint8_t *local_5d0;
  string *local_5c8;
  uint32_t *local_5c0;
  char *local_5b8 [2];
  char local_5a8 [16];
  char *local_598 [2];
  char local_588 [16];
  char *local_578 [2];
  char local_568 [16];
  char *local_558 [2];
  char local_548 [16];
  char *local_538 [2];
  char local_528 [16];
  uchar *local_518 [2];
  uchar local_508 [16];
  emsg local_4f8;
  undefined1 local_418 [252];
  uint uStack_31c;
  uint64_t uStack_318;
  _Alloc_hider local_310;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  uint8_t local_2f0 [8];
  uint8_t auStack_2e8 [8];
  undefined1 local_2e0 [24];
  undefined2 uStack_2c8;
  undefined **local_2c0;
  undefined8 local_2b8;
  uint64_t uStack_2b0;
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  pointer local_288;
  uint8_t auStack_280 [8];
  undefined1 local_278 [24];
  undefined2 uStack_260;
  undefined8 local_258 [3];
  mfhd local_240;
  tfhd local_1d0;
  tfdt local_140;
  trun local_c8;
  
  if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) == 0) {
    local_6a8.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_6a8.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_6a8.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __buf = (void *)CONCAT71(in_register_00000011,init_only);
    do {
      if (*(int *)(infile + *(long *)(*(long *)infile + -0x18) + 0x20) != 0) break;
      local_418._0_8_ = &PTR_size_0011eb68;
      local_418._8_4_ = 0;
      local_418._16_8_ = 0;
      local_418._24_8_ = local_418 + 0x28;
      local_418._32_8_ = 0;
      local_418[0x28] = '\0';
      local_418._88_2_ = 0;
      local_418._90_8_ = 0;
      local_418._72_8_ = (pointer)0x0;
      local_418._80_2_ = 0;
      local_418._82_6_ = 0;
      sVar11 = box::read((box *)local_418,(int)infile,__buf,in_RCX);
      if ((char)sVar11 == '\0') {
        bVar19 = false;
        __buf = extraout_RDX;
      }
      else {
        std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::push_back
                  (&local_6a8,(value_type *)local_418);
        iVar10 = std::__cxx11::string::compare(local_418 + 0x18);
        bVar19 = iVar10 != 0;
        __buf = extraout_RDX_00;
      }
      local_418._0_8_ = &PTR_size_0011eb68;
      if ((pointer)local_418._72_8_ != (pointer)0x0) {
        operator_delete((void *)local_418._72_8_);
        __buf = extraout_RDX_01;
      }
      if ((undefined1 *)local_418._24_8_ != local_418 + 0x28) {
        operator_delete((void *)local_418._24_8_);
        __buf = extraout_RDX_02;
      }
    } while (bVar19);
    local_6bc = SUB84((void *)CONCAT71(in_register_00000011,init_only),0);
    bVar19 = local_6a8.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>.
             _M_impl.super__Vector_impl_data._M_start ==
             local_6a8.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (!bVar19) {
      local_5c0 = &(this->init_fragment_).ftyp_box_.size_;
      local_5c8 = (string *)&(this->init_fragment_).ftyp_box_.box_type_;
      local_5d0 = (this->init_fragment_).ftyp_box_.extended_type_;
      local_5e0 = (string *)&(this->init_fragment_).moov_box_.box_type_;
      local_5f0 = (this->init_fragment_).moov_box_.extended_type_;
      local_5f8 = &(this->init_fragment_).moov_box_.box_data_;
      local_600 = (undefined8 *)(local_418 + 0xb0);
      local_6c8 = (vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_> *)
                  (local_418 + 0xd0);
      local_608 = local_258;
      local_6b8 = &local_4f8.value_.field_2;
      local_6b0 = &local_4f8.scheme_id_uri_.field_2;
      local_610 = &this->media_fragment_;
      local_618 = &(this->mfra_box_).size_;
      local_5d8 = &(this->init_fragment_).ftyp_box_.box_data_;
      local_5e8 = &(this->init_fragment_).moov_box_.size_;
      local_620 = (string *)&(this->mfra_box_).box_type_;
      local_638 = (this->mfra_box_).extended_type_;
      local_640 = &(this->mfra_box_).box_data_;
      local_628 = &(this->sidx_box_).size_;
      local_630 = (string *)&(this->sidx_box_).box_type_;
      local_648 = (this->sidx_box_).extended_type_;
      local_650 = &(this->sidx_box_).box_data_;
      local_658 = &(this->meta_box_).size_;
      local_660 = (string *)&(this->meta_box_).box_type_;
      local_668 = (this->meta_box_).extended_type_;
      local_670 = &(this->meta_box_).box_data_;
      pbVar17 = local_6a8.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar4 = (pbVar17->box_type_)._M_dataplus._M_p;
        local_538[0] = local_528;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_538,"ftyp","");
        if ((((*pcVar4 != *local_538[0]) || (pcVar4[1] != local_538[0][1])) ||
            (pcVar4[2] != local_538[0][2])) || (bVar8 = true, pcVar4[3] != local_538[0][3])) {
          bVar8 = false;
        }
        if (local_538[0] != local_528) {
          operator_delete(local_538[0]);
        }
        if (bVar8) {
          uVar6 = pbVar17->large_size_;
          *(pointer *)local_5c0 = *(pointer *)&pbVar17->size_;
          *(uint64_t *)(local_5c0 + 2) = uVar6;
          std::__cxx11::string::_M_assign(local_5c8);
          uVar7 = *(undefined8 *)(pbVar17->extended_type_ + 8);
          *(undefined8 *)local_5d0 = *(undefined8 *)pbVar17->extended_type_;
          *(undefined8 *)(local_5d0 + 8) = uVar7;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_5d8,&pbVar17->box_data_);
          bVar8 = pbVar17->has_uuid_;
          (this->init_fragment_).ftyp_box_.is_large_ = pbVar17->is_large_;
          (this->init_fragment_).ftyp_box_.has_uuid_ = bVar8;
        }
        pcVar4 = (pbVar17->box_type_)._M_dataplus._M_p;
        local_558[0] = local_548;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_558,"moov","");
        if (((*pcVar4 != *local_558[0]) || (pcVar4[1] != local_558[0][1])) ||
           ((pcVar4[2] != local_558[0][2] || (bVar8 = true, pcVar4[3] != local_558[0][3])))) {
          bVar8 = false;
        }
        if (local_558[0] != local_548) {
          operator_delete(local_558[0]);
        }
        if (bVar8) {
          uVar6 = pbVar17->large_size_;
          *(pointer *)local_5e8 = *(pointer *)&pbVar17->size_;
          *(uint64_t *)(local_5e8 + 2) = uVar6;
          std::__cxx11::string::_M_assign(local_5e0);
          uVar7 = *(undefined8 *)(pbVar17->extended_type_ + 8);
          *(undefined8 *)local_5f0 = *(undefined8 *)pbVar17->extended_type_;
          *(undefined8 *)(local_5f0 + 8) = uVar7;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_5f8,&pbVar17->box_data_);
          bVar8 = pbVar17->has_uuid_;
          (this->init_fragment_).moov_box_.is_large_ = pbVar17->is_large_;
          (this->init_fragment_).moov_box_.has_uuid_ = bVar8;
          if ((char)local_6bc != '\0') {
            std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::~vector(&local_6a8);
            if (!bVar19) {
              return 0;
            }
            goto LAB_00114d0c;
          }
        }
        pcVar4 = (pbVar17->box_type_)._M_dataplus._M_p;
        local_578[0] = local_568;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"moof","");
        if (((*pcVar4 != *local_578[0]) || (pcVar4[1] != local_578[0][1])) ||
           ((pcVar4[2] != local_578[0][2] || (bVar19 = true, pcVar4[3] != local_578[0][3])))) {
          bVar19 = false;
        }
        if (local_578[0] != local_568) {
          operator_delete(local_578[0]);
        }
        puVar9 = local_608;
        if (bVar19) {
          local_418._0_8_ = &PTR_size_0011eb68;
          local_418._8_4_ = 0;
          local_418._16_8_ = 0;
          local_418._24_8_ = local_418 + 0x28;
          local_418._32_8_ = 0;
          local_418[0x28] = '\0';
          local_418._88_2_ = 0;
          local_418._90_8_ = 0;
          local_418._72_8_ = (pointer)0x0;
          local_418._80_2_ = 0;
          local_418._82_6_ = 0;
          local_418._104_8_ = &PTR_size_0011eb68;
          local_418._112_4_ = 0;
          local_418._120_8_ = 0;
          local_418._136_8_ = 0;
          local_418[0x90] = '\0';
          *(undefined8 *)((long)local_600 + 10) = 0;
          *(undefined8 *)((long)local_600 + 0x12) = 0;
          *local_600 = 0;
          local_600[1] = 0;
          *(undefined8 *)
           ((long)&(local_6c8->
                   super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>).
                   _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
          *(undefined8 *)
           ((long)&(local_6c8->
                   super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
          (local_6c8->super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>).
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (local_6c8->super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>).
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_418._240_8_ = &PTR_size_0011eb68;
          stack0xfffffffffffffce0 = (pointer)((ulong)uStack_31c << 0x20);
          uStack_318 = 0;
          local_310._M_p = (pointer)&local_300;
          local_308 = 0;
          local_300._M_local_buf[0] = '\0';
          local_2e0._16_2_ = 0;
          stack0xfffffffffffffd32 = 0;
          local_2e0._0_8_ = (pointer)0x0;
          local_2e0._8_2_ = 0;
          local_2e0._10_6_ = 0;
          local_2c0 = &PTR_size_0011eb68;
          local_2b8 = (pointer)((ulong)local_2b8._4_4_ << 0x20);
          uStack_2b0 = 0;
          local_2a8._M_p = (pointer)&local_298;
          local_2a0 = 0;
          local_298._M_local_buf[0] = '\0';
          local_278._16_2_ = 0;
          stack0xfffffffffffffd9a = 0;
          local_278._0_8_ = (pointer)0x0;
          local_278._8_2_ = 0;
          local_278._10_6_ = 0;
          *(undefined4 *)(local_608 + 2) = 0;
          *local_608 = 0;
          local_608[1] = 0;
          local_418._128_8_ = local_418 + 0x90;
          mfhd::mfhd(&local_240);
          tfhd::tfhd(&local_1d0);
          tfdt::tfdt(&local_140);
          trun::trun(&local_c8);
          unique0x10000b78 = *(pointer *)&pbVar17->size_;
          uStack_318 = pbVar17->large_size_;
          std::__cxx11::string::_M_assign((string *)&local_310);
          local_2f0 = *(uint8_t (*) [8])pbVar17->extended_type_;
          auStack_2e8 = *(uint8_t (*) [8])(pbVar17->extended_type_ + 8);
          __x = &pbVar17->box_data_;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2e0,__x);
          uVar7 = stack0xfffffffffffffd32;
          uVar2 = pbVar17->is_large_;
          uVar3 = pbVar17->has_uuid_;
          uStack_2c8._1_1_ = (bool)uVar3;
          uStack_2c8._0_1_ = (bool)uVar2;
          local_2e0._18_6_ = (undefined6)uVar7;
          init_fragment::get_trex((trex *)&local_4f8,&this->init_fragment_);
          *(undefined4 *)(puVar9 + 2) = (undefined4)local_4f8.super_full_box.super_box.large_size_;
          *puVar9 = local_4f8.super_full_box.super_box._vptr_box;
          puVar9[1] = local_4f8.super_full_box.super_box._8_8_;
          iVar10 = std::__cxx11::string::compare((char *)&pbVar17[-1].box_type_);
          if (iVar10 == 0) {
            emsg::emsg(&local_4f8);
            puVar5 = pbVar17[-1].box_data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            emsg::parse(&local_4f8,(char *)puVar5,
                        *(int *)&pbVar17[-1].box_data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (int)puVar5);
            std::vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>::push_back
                      (local_6c8,&local_4f8);
            local_4f8.super_full_box.super_box._vptr_box = (_func_int **)&PTR_size_0011ed58;
            if (local_4f8.message_data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_4f8.message_data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8.value_._M_dataplus._M_p != local_6b8) {
              operator_delete(local_4f8.value_._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8.scheme_id_uri_._M_dataplus._M_p != local_6b0) {
              operator_delete(local_4f8.scheme_id_uri_._M_dataplus._M_p);
            }
            local_4f8.super_full_box.super_box._vptr_box = (_func_int **)&PTR_size_0011eb68;
            if (local_4f8.super_full_box.super_box.box_data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_4f8.super_full_box.super_box.box_data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8.super_full_box.super_box.box_type_._M_dataplus._M_p !=
                &local_4f8.super_full_box.super_box.box_type_.field_2) {
              operator_delete(local_4f8.super_full_box.super_box.box_type_._M_dataplus._M_p);
            }
          }
          do {
            pvVar16 = __x;
            puVar5 = *(pointer *)
                      ((long)&pvVar16[2].
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl + 8);
            local_518[0] = local_508;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"mdat","");
            if ((((*puVar5 != *local_518[0]) || (puVar5[1] != local_518[0][1])) ||
                (puVar5[2] != local_518[0][2])) || (bVar19 = true, puVar5[3] != local_518[0][3])) {
              bVar19 = false;
            }
            if (local_518[0] != local_508) {
              operator_delete(local_518[0]);
            }
            __x = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                  ((long)&pvVar16[4].
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + 8);
          } while (!bVar19);
          local_2b8 = *(pointer *)((long)(pvVar16 + 1) + 0x10);
          uStack_2b0 = *(uint64_t *)
                        &pvVar16[2].
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
          std::__cxx11::string::_M_assign((string *)&local_2a8);
          local_288 = *(pointer *)
                       ((long)&pvVar16[3].
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl + 0x10);
          auStack_280 = *(uint8_t (*) [8])
                         &pvVar16[4].
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278,__x);
          uStack_260 = *(undefined2 *)
                        ((long)&pvVar16[5].
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl + 8);
          media_fragment::parse_moof((media_fragment *)local_418);
          pbVar17 = (pointer)((long)(pvVar16 + 1) + 8);
          uVar18 = 8;
          do {
            uVar12 = CONCAT62(local_278._10_6_,local_278._8_2_) - local_278._0_8_;
            if (uVar12 <= uVar18) break;
            _local_6d8 = 0;
            lVar15 = 0;
            do {
              *(uchar *)((long)&local_6d8 + lVar15) =
                   *(pointer)(local_278._0_8_ + (ulong)(uVar18 + (int)lVar15));
              lVar15 = lVar15 + 1;
            } while (lVar15 != 8);
            local_6d0 = 0;
            data_size = local_6d8 >> 0x18 | (local_6d8 & 0xff0000) >> 8 | (local_6d8 & 0xff00) << 8
                        | local_6d8 << 0x18;
            if (uVar12 < data_size) {
              bVar19 = true;
            }
            else {
              local_690[0] = local_680;
              sVar13 = strlen((char *)&uStack_6d4);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_690,&uStack_6d4,(char *)((long)&uStack_6d4 + sVar13));
              pcVar4 = local_690[0];
              local_598[0] = local_588;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"emsg","");
              if (((*pcVar4 != *local_598[0]) || (pcVar4[1] != local_598[0][1])) ||
                 ((pcVar4[2] != local_598[0][2] || (bVar19 = true, pcVar4[3] != local_598[0][3]))))
              {
                bVar19 = false;
              }
              if (local_598[0] != local_588) {
                operator_delete(local_598[0]);
              }
              pcVar4 = local_690[0];
              if (bVar19) {
                emsg::emsg(&local_4f8);
                emsg::parse(&local_4f8,(char *)(local_278._0_8_ + (ulong)uVar18),data_size);
                std::vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>::push_back
                          (local_6c8,&local_4f8);
                local_418[0xe8] = true;
                local_4f8.super_full_box.super_box._vptr_box = (_func_int **)&PTR_size_0011ed58;
                if (local_4f8.message_data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_4f8.message_data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4f8.value_._M_dataplus._M_p != local_6b8) {
                  operator_delete(local_4f8.value_._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4f8.scheme_id_uri_._M_dataplus._M_p != local_6b0) {
                  operator_delete(local_4f8.scheme_id_uri_._M_dataplus._M_p);
                }
                local_4f8.super_full_box.super_box._vptr_box = (_func_int **)&PTR_size_0011eb68;
                if (local_4f8.super_full_box.super_box.box_data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_4f8.super_full_box.super_box.box_data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4f8.super_full_box.super_box.box_type_._M_dataplus._M_p !=
                    &local_4f8.super_full_box.super_box.box_type_.field_2) {
                  operator_delete(local_4f8.super_full_box.super_box.box_type_._M_dataplus._M_p);
                }
                bVar19 = false;
              }
              else {
                local_5b8[0] = local_5a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"embe","");
                if (((*pcVar4 != *local_5b8[0]) || (pcVar4[1] != local_5b8[0][1])) ||
                   ((pcVar4[2] != local_5b8[0][2] || (bVar19 = true, pcVar4[3] != local_5b8[0][3])))
                   ) {
                  bVar19 = false;
                }
                if (local_5b8[0] != local_5a8) {
                  operator_delete(local_5b8[0]);
                }
                if (!bVar19) {
                  data_size = 0;
                }
                bVar19 = (bool)(bVar19 ^ 1);
              }
              if (local_690[0] != local_680) {
                operator_delete(local_690[0]);
              }
              uVar18 = data_size + uVar18;
            }
          } while (!bVar19);
          std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>::
          push_back(local_610,(media_fragment *)local_418);
          media_fragment::~media_fragment((media_fragment *)local_418);
        }
        psVar1 = &pbVar17->box_type_;
        iVar10 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar10 == 0) {
          uVar6 = pbVar17->large_size_;
          *(pointer *)local_618 = *(pointer *)&pbVar17->size_;
          *(uint64_t *)(local_618 + 2) = uVar6;
          std::__cxx11::string::_M_assign(local_620);
          uVar7 = *(undefined8 *)(pbVar17->extended_type_ + 8);
          *(undefined8 *)local_638 = *(undefined8 *)pbVar17->extended_type_;
          *(undefined8 *)(local_638 + 8) = uVar7;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_640,&pbVar17->box_data_);
          bVar19 = pbVar17->has_uuid_;
          (this->mfra_box_).is_large_ = pbVar17->is_large_;
          (this->mfra_box_).has_uuid_ = bVar19;
        }
        iVar10 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar10 == 0) {
          uVar6 = pbVar17->large_size_;
          *(pointer *)local_628 = *(pointer *)&pbVar17->size_;
          *(uint64_t *)(local_628 + 2) = uVar6;
          std::__cxx11::string::_M_assign(local_630);
          uVar7 = *(undefined8 *)(pbVar17->extended_type_ + 8);
          *(undefined8 *)local_648 = *(undefined8 *)pbVar17->extended_type_;
          *(undefined8 *)(local_648 + 8) = uVar7;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_650,&pbVar17->box_data_);
          bVar19 = pbVar17->has_uuid_;
          (this->sidx_box_).is_large_ = pbVar17->is_large_;
          (this->sidx_box_).has_uuid_ = bVar19;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|sidx|",6);
        }
        iVar10 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar10 == 0) {
          uVar6 = pbVar17->large_size_;
          *(pointer *)local_658 = *(pointer *)&pbVar17->size_;
          *(uint64_t *)(local_658 + 2) = uVar6;
          std::__cxx11::string::_M_assign(local_660);
          uVar7 = *(undefined8 *)(pbVar17->extended_type_ + 8);
          *(undefined8 *)local_668 = *(undefined8 *)pbVar17->extended_type_;
          *(undefined8 *)(local_668 + 8) = uVar7;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_670,&pbVar17->box_data_);
          bVar19 = pbVar17->has_uuid_;
          (this->meta_box_).is_large_ = pbVar17->is_large_;
          (this->meta_box_).has_uuid_ = bVar19;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|meta|",6);
        }
        pbVar17 = pbVar17 + 1;
        bVar19 = pbVar17 ==
                 local_6a8.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      } while (!bVar19);
    }
    std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::~vector(&local_6a8);
  }
LAB_00114d0c:
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"***  finished reading fmp4 fragments  ***",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"***  read  fmp4 init fragment         ***",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"***  read ",10);
  poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," fmp4 media fragments ***",0x19);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  std::ostream::put((char)poVar14);
  std::ostream::flush();
  return 0;
}

Assistant:

int ingest_stream::load_from_file(std::istream &infile, bool init_only)
	{
		try
		{
			if (infile)
			{
				std::vector<box> ingest_boxes;

				while (infile.good()) // read box by box in a vector
				{
					box b = {};
					if (b.read(infile))
						ingest_boxes.push_back(b);
					else  // break when we have boxes of size zero
						break;

					if (b.box_type_.compare("mfra") == 0)
						break;
				}

				// organize the boxes in init fragments and media fragments 
				for (auto it = ingest_boxes.begin(); it != ingest_boxes.end(); ++it)
				{
					if (f_compare_4cc( (char *)it->box_type_.c_str(), "ftyp"))
						init_fragment_.ftyp_box_ = *it;
					if (f_compare_4cc((char*)it->box_type_.c_str(), "moov"))
					{
						init_fragment_.moov_box_ = *it;
						
						if (init_only)
							return 0;
					}

					if (f_compare_4cc((char*)it->box_type_.c_str(), "moof")) // in case of moof box we push both the moof and following mdat
					{
						media_fragment m = {};
						m.moof_box_ = *it;
						m.trex_ = init_fragment_.get_trex();
						bool mdat_found = false;
						auto prev_box = (it - 1);
						// see if there is an emsg before
						if (prev_box->box_type_.compare("emsg") == 0)
						{
							emsg e;
							e.parse((char *)& prev_box->box_data_[0], (unsigned int)prev_box->box_data_.size());
							m.emsg_.push_back(e);
							//cout << "|emsg|";
							//std::cout << "found inband dash emsg box" << std::endl;
						}
						//cout << "|moof|";
						while (!mdat_found)
						{
							it++;

							if (f_compare_4cc((char*)it->box_type_.c_str(), "mdat"))
							{
								// find event messages embedded in 

								m.mdat_box_ = *it;
								mdat_found = true;
								m.parse_moof();

								uint32_t index = 8;

								while (index < m.mdat_box_.box_data_.size())
								{
									// seek to next box in 
									uint8_t name[9] = {};
									for (uint32_t i = 0; i < 8; i++)
										name[i] = m.mdat_box_.box_data_[index + i];
									name[8] = '\0';
									uint32_t l_size = fmp4_read_uint32((char *)name);

									if (l_size > m.mdat_box_.box_data_.size())
										break;

									std::string enc_box_name((char *)&name[4]);

									if (f_compare_4cc((char*)enc_box_name.c_str(), "emsg") ) // right now we can only parse a single emsg, todo update to parse multiple emsg
									{
										emsg e = {};
										e.parse((char *)&m.mdat_box_.box_data_[index], (unsigned int)l_size);
										m.emsg_.push_back(e);
										m.e_msg_is_in_mdat_ = true;
										index += l_size;
										continue;
									}
									if (f_compare_4cc((char*)enc_box_name.c_str(), "embe"))
									{
										index += l_size;
										continue;
									}
									break; // skip on all other mdat content only embe and emsg allowed
								}

								media_fragment_.push_back(m);

								break;
							}
						}
					}
					if (it->box_type_.compare("mfra") == 0)
					{
						this->mfra_box_ = *it;
					}
					if (it->box_type_.compare("sidx") == 0)
					{
						this->sidx_box_ = *it;
						std::cout << "|sidx|";
					}
					if (it->box_type_.compare("meta") == 0)
					{
						this->meta_box_ = *it;
						std::cout << "|meta|";
					}
				}
			}
			std::cout << std::endl;
			std::cout << "***  finished reading fmp4 fragments  ***" << std::endl;
			std::cout << "***  read  fmp4 init fragment         ***" << std::endl;
			std::cout << "***  read " << media_fragment_.size() << " fmp4 media fragments ***" << std::endl;

			return 0;
		}
		catch (std::exception e)
		{
			std::cout << e.what() << std::endl;
			return 0;
		}
	}